

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.hpp
# Opt level: O2

void __thiscall ixy::IxgbeDevice::~IxgbeDevice(IxgbeDevice *this)

{
  ~IxgbeDevice(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

static auto
    init(const std::string &pci_addr, uint16_t num_rx_queues,
         uint16_t num_tx_queues) -> std::unique_ptr<IxgbeDevice> {
        if (getuid()) {
            warn("not running as root, this will probably fail");
        }

        if (num_rx_queues > MAX_QUEUES) {
            error("cannot configure " << num_rx_queues << " rx queues: limit is " << MAX_QUEUES);
        }

        if (num_tx_queues > MAX_QUEUES) {
            error("cannot configure " << num_tx_queues << " tx queues: limit is " << MAX_QUEUES);
        }

        std::vector<ixgbe_rx_queue> rx_queues;
        std::vector<ixgbe_tx_queue> tx_queues;

        rx_queues.reserve(num_rx_queues);
        tx_queues.reserve(num_tx_queues);

        auto mapped_region = pci_map_resource(pci_addr);

        auto addr = mapped_region.first;
        auto len = mapped_region.second;

        auto dev = IxgbeDevice{pci_addr, addr, len, num_rx_queues, num_tx_queues, rx_queues, tx_queues};

        dev.reset_and_init();

        return std::make_unique<IxgbeDevice>(std::move(dev));
    }